

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall ctemplate::BaseArena::~BaseArena(BaseArena *this)

{
  long lVar1;
  AllocatedBlock *pAVar2;
  
  this->_vptr_BaseArena = (_func_int **)&PTR__BaseArena_0014dbe0;
  FreeBlocks(this);
  if (this->overflow_blocks_ ==
      (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
       *)0x0) {
    lVar1 = (long)this->first_block_we_own_;
    if (this->first_block_we_own_ < this->blocks_alloced_) {
      pAVar2 = this->first_blocks_ + lVar1;
      do {
        free(pAVar2->mem);
        lVar1 = lVar1 + 1;
        pAVar2 = pAVar2 + 1;
      } while (lVar1 < this->blocks_alloced_);
    }
    return;
  }
  __assert_fail("overflow_blocks_ == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                ,0x8b,"virtual ctemplate::BaseArena::~BaseArena()");
}

Assistant:

BaseArena::~BaseArena() {
  FreeBlocks();
  assert(overflow_blocks_ == NULL);    // FreeBlocks() should do that
  // The first X blocks stay allocated always by default.  Delete them now.
  for ( int i = first_block_we_own_; i < blocks_alloced_; ++i )
    free(first_blocks_[i].mem);
}